

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O2

int __thiscall
QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::clone
          (QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  QNetworkRequestFactoryPrivate *this_00;
  
  this_00 = (QNetworkRequestFactoryPrivate *)operator_new(0x88);
  QNetworkRequestFactoryPrivate::QNetworkRequestFactoryPrivate(this_00,(this->d).ptr);
  return (int)this_00;
}

Assistant:

Q_INLINE_TEMPLATE T *QExplicitlySharedDataPointer<T>::clone()
{
    return new T(*d.get());
}